

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O0

SinkCombineResultType __thiscall
duckdb::PhysicalCopyToFile::Combine
          (PhysicalCopyToFile *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  code *pcVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  bool bVar3;
  CopyToFunctionGlobalState *pCVar4;
  CopyToFunctionLocalState *pCVar5;
  type pFVar6;
  type pGVar7;
  type pLVar8;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *in_RSI;
  long in_RDI;
  GlobalSinkState *unaff_retaddr;
  ExecutionContext *in_stack_00000008;
  PhysicalCopyToFile *in_stack_00000010;
  CopyToFunctionLocalState *l;
  CopyToFunctionGlobalState *g;
  CopyToFunctionGlobalState *in_stack_00000218;
  PhysicalCopyToFile *in_stack_00000220;
  ExecutionContext *in_stack_00000228;
  CopyToFunctionLocalState *in_stack_00000230;
  GlobalSinkState *in_stack_ffffffffffffff10;
  anon_class_24_3_2a0cbf70 *in_stack_ffffffffffffff18;
  function<void_(duckdb::GlobalFunctionData_&)> *in_stack_ffffffffffffff20;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pCVar4 = GlobalSinkState::Cast<duckdb::CopyToFunctionGlobalState>(in_stack_ffffffffffffff10);
  pCVar5 = LocalSinkState::Cast<duckdb::CopyToFunctionLocalState>
                     ((LocalSinkState *)in_stack_ffffffffffffff10);
  if (pCVar5->total_rows_copied != 0) {
    ::std::__atomic_base<unsigned_long>::operator+=
              (&(pCVar4->rows_copied).super___atomic_base<unsigned_long>,pCVar5->total_rows_copied);
    if ((*(byte *)(in_RDI + 0x3c2) & 1) == 0) {
      if (*(long *)(in_RDI + 0x100) != 0) {
        if ((*(byte *)(in_RDI + 0x3b2) & 1) == 0) {
          if ((*(byte *)(in_RDI + 0x3c0) & 1) == 0) {
            bVar3 = ::std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
                                *)0x1868462);
            if (bVar3) {
              pcVar1 = *(code **)(in_RDI + 0x100);
              pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       ::operator*(in_RSI);
              pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                       ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                                    *)in_RSI);
              pLVar8 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                       ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                    *)in_RSI);
              (*pcVar1)(in_RSI,pFVar6,pGVar7,pLVar8);
            }
          }
          else {
            ::std::function<void(duckdb::GlobalFunctionData&)>::
            function<duckdb::PhysicalCopyToFile::Combine(duckdb::ExecutionContext&,duckdb::OperatorSinkCombineInput&)const::__0,void>
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            WriteRotateInternal(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                                (function<void_(duckdb::GlobalFunctionData_&)> *)
                                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
            ::std::function<void_(duckdb::GlobalFunctionData_&)>::~function
                      ((function<void_(duckdb::GlobalFunctionData_&)> *)0x1868423);
          }
        }
        else {
          bVar3 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
                              *)0x18682b1);
          if (bVar3) {
            pcVar1 = *(code **)(in_RDI + 0x100);
            pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                  *)in_stack_ffffffffffffff10);
            pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                                  *)in_stack_ffffffffffffff10);
            pLVar8 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                  *)in_stack_ffffffffffffff10);
            (*pcVar1)(in_RSI,pFVar6,pGVar7,pLVar8);
            pcVar1 = *(code **)(in_RDI + 0x108);
            _Var2._M_head_impl =
                 (in_RSI->
                 super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                 .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
            pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                  *)in_stack_ffffffffffffff10);
            pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                                  *)in_stack_ffffffffffffff10);
            (*pcVar1)(_Var2._M_head_impl,pFVar6,pGVar7);
          }
        }
      }
    }
    else {
      CopyToFunctionLocalState::FlushPartitions
                (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218);
    }
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalCopyToFile::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &g = input.global_state.Cast<CopyToFunctionGlobalState>();
	auto &l = input.local_state.Cast<CopyToFunctionLocalState>();
	if (l.total_rows_copied == 0) {
		// no rows copied
		return SinkCombineResultType::FINISHED;
	}
	g.rows_copied += l.total_rows_copied;

	if (partition_output) {
		// flush all remaining partitions
		l.FlushPartitions(context, *this, g);
	} else if (function.copy_to_combine) {
		if (per_thread_output) {
			// For PER_THREAD_OUTPUT, we can combine/finalize immediately (if there is a gstate)
			if (l.global_state) {
				function.copy_to_combine(context, *bind_data, *l.global_state, *l.local_state);
				function.copy_to_finalize(context.client, *bind_data, *l.global_state);
			}
		} else if (rotate) {
			WriteRotateInternal(context, input.global_state, [&](GlobalFunctionData &gstate) {
				function.copy_to_combine(context, *bind_data, gstate, *l.local_state);
			});
		} else if (g.global_state) {
			function.copy_to_combine(context, *bind_data, *g.global_state, *l.local_state);
		}
	}

	return SinkCombineResultType::FINISHED;
}